

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cc
# Opt level: O1

string * utils::getTimestamp_abi_cxx11_(void)

{
  tm *ptVar1;
  string *in_RDI;
  time_t now;
  char buf [80];
  tm tstruct;
  time_t local_b0;
  char local_a8 [80];
  tm local_58;
  
  local_b0 = time((time_t *)0x0);
  local_58.tm_isdst = 0;
  local_58._36_4_ = 0;
  local_58.tm_gmtoff = 0;
  local_58.tm_mon = 0;
  local_58.tm_year = 0;
  local_58.tm_wday = 0;
  local_58.tm_yday = 0;
  local_58.tm_sec = 0;
  local_58.tm_min = 0;
  local_58.tm_hour = 0;
  local_58.tm_mday = 0;
  local_58.tm_zone = (char *)0x0;
  ptVar1 = localtime(&local_b0);
  local_58.tm_sec = ptVar1->tm_sec;
  local_58.tm_min = ptVar1->tm_min;
  local_58.tm_hour = ptVar1->tm_hour;
  local_58.tm_mday = ptVar1->tm_mday;
  local_58.tm_mon = ptVar1->tm_mon;
  local_58.tm_year = ptVar1->tm_year;
  local_58.tm_wday = ptVar1->tm_wday;
  local_58.tm_yday = ptVar1->tm_yday;
  local_58.tm_isdst = ptVar1->tm_isdst;
  local_58._36_4_ = *(undefined4 *)&ptVar1->field_0x24;
  local_58.tm_gmtoff = ptVar1->tm_gmtoff;
  local_58.tm_zone = ptVar1->tm_zone;
  strftime(local_a8,0x50,"%X",&local_58);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  strlen(local_a8);
  std::__cxx11::string::_M_construct<char_const*>();
  return in_RDI;
}

Assistant:

std::string utils::getTimestamp()
{
    time_t now = time(nullptr);
    struct tm tstruct = tm();
#ifdef WIN32
    localtime_s(&tstruct, &now);
#else
    tstruct = *localtime(&now);
#endif
    char buf[80];
    strftime(static_cast<char*>(buf), sizeof(buf), "%X", &tstruct);
    return std::string(static_cast<char*>(buf));
}